

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_adjust_closed_stream(nghttp2_session *session)

{
  uint uVar1;
  nghttp2_session *session_00;
  bool bVar2;
  int iVar3;
  long in_RDI;
  nghttp2_stream *next;
  nghttp2_stream *head_stream;
  int rv;
  size_t num_stream_max;
  nghttp2_stream *stream;
  ulong local_18;
  
  if (*(int *)(in_RDI + 0xb4c) == -1) {
    uVar1 = *(uint *)(in_RDI + 0xb68);
  }
  else {
    uVar1 = *(uint *)(in_RDI + 0xb4c);
  }
  local_18 = (ulong)uVar1;
  while( true ) {
    bVar2 = false;
    if (*(long *)(in_RDI + 0xaa8) != 0) {
      bVar2 = local_18 < (ulong)(*(long *)(in_RDI + 0xaa8) + *(long *)(in_RDI + 0xa90));
    }
    if (!bVar2) {
      return 0;
    }
    session_00 = *(nghttp2_session **)(in_RDI + 0xa38);
    if (session_00 == (nghttp2_session *)0x0) {
      __assert_fail("head_stream",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                    ,0x680,"int nghttp2_session_adjust_closed_stream(nghttp2_session *)");
    }
    stream = (session_00->root).dep_next;
    iVar3 = nghttp2_session_destroy_stream(session_00,stream);
    if (iVar3 != 0) break;
    *(nghttp2_stream **)(in_RDI + 0xa38) = stream;
    if (*(long *)(in_RDI + 0xa38) == 0) {
      *(undefined8 *)(in_RDI + 0xa40) = 0;
    }
    else {
      *(undefined8 *)(*(long *)(in_RDI + 0xa38) + 0x80) = 0;
    }
    *(long *)(in_RDI + 0xaa8) = *(long *)(in_RDI + 0xaa8) + -1;
  }
  return iVar3;
}

Assistant:

int nghttp2_session_adjust_closed_stream(nghttp2_session *session) {
  size_t num_stream_max;
  int rv;

  if (session->local_settings.max_concurrent_streams ==
      NGHTTP2_DEFAULT_MAX_CONCURRENT_STREAMS) {
    num_stream_max = session->pending_local_max_concurrent_stream;
  } else {
    num_stream_max = session->local_settings.max_concurrent_streams;
  }

  DEBUGF("stream: adjusting kept closed streams num_closed_streams=%zu, "
         "num_incoming_streams=%zu, max_concurrent_streams=%zu\n",
         session->num_closed_streams, session->num_incoming_streams,
         num_stream_max);

  while (session->num_closed_streams > 0 &&
         session->num_closed_streams + session->num_incoming_streams >
           num_stream_max) {
    nghttp2_stream *head_stream;
    nghttp2_stream *next;

    head_stream = session->closed_stream_head;

    assert(head_stream);

    next = head_stream->closed_next;

    rv = nghttp2_session_destroy_stream(session, head_stream);
    if (rv != 0) {
      return rv;
    }

    /* head_stream is now freed */

    session->closed_stream_head = next;

    if (session->closed_stream_head) {
      session->closed_stream_head->closed_prev = NULL;
    } else {
      session->closed_stream_tail = NULL;
    }

    --session->num_closed_streams;
  }

  return 0;
}